

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

string * __thiscall
Diligent::
FormatString<char[29],unsigned_int,char[3],char_const*,char[55],char_const*,char[4],char_const*,char[3]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [29],uint *Args_1,
          char (*Args_2) [3],char **Args_3,char (*Args_4) [55],char **Args_5,char (*Args_6) [4],
          char **Args_7,char (*Args_8) [3])

{
  stringstream ss;
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  FormatStrSS<std::__cxx11::stringstream,char[29],unsigned_int,char[3],char_const*,char[55],char_const*,char[4],char_const*,char[3]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [29])this,(uint *)Args,(char (*) [3])Args_1,(char **)Args_2,
             (char (*) [55])Args_3,(char **)Args_4,(char (*) [4])Args_5,(char **)Args_6,
             (char (*) [3])Args_7);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}